

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zsp_blas3.c
# Opt level: O3

int sp_zgemm(char *transa,char *transb,int m,int n,int k,doublecomplex alpha,SuperMatrix *A,
            doublecomplex *b,int ldb,doublecomplex beta,doublecomplex *c,int ldc)

{
  ulong uVar1;
  
  if (0 < n) {
    uVar1 = (ulong)(uint)n;
    do {
      sp_zgemv(transa,alpha,A,b,1,beta,c,1);
      c = c + ldc;
      b = b + ldb;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  return 0;
}

Assistant:

int
sp_zgemm(char *transa, char *transb, int m, int n, int k, 
         doublecomplex alpha, SuperMatrix *A, doublecomplex *b, int ldb, 
         doublecomplex beta, doublecomplex *c, int ldc)
{
    int    incx = 1, incy = 1;
    int    j;

    for (j = 0; j < n; ++j) {
	sp_zgemv(transa, alpha, A, &b[ldb*j], incx, beta, &c[ldc*j], incy);
    }
    return 0;    
}